

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O0

int menu_bar_sub_win_top_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  int local_48 [2];
  int y;
  int x;
  int overlap;
  int height;
  Am_Widget_Look look;
  Am_Object local_28;
  Am_Object menu_bar;
  Am_Object for_item;
  Am_Object *self_local;
  
  pAVar2 = Am_Object::Get(self,0x1d3,0);
  Am_Object::Am_Object(&menu_bar,pAVar2);
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)&menu_bar);
  pAVar2 = Am_Object::Get(&local_28,0x17f,0);
  Am_Widget_Look::Am_Widget_Look((Am_Widget_Look *)&overlap,pAVar2);
  pAVar2 = Am_Object::Get(&local_28,0x67,0);
  x = Am_Value::operator_cast_to_int(pAVar2);
  y = 0;
  if (overlap == 0) {
    y = 5;
  }
  else if (overlap == 1) {
    y = 3;
  }
  else {
    if (overlap != 2) {
      Am_Error("Unknown Look parameter");
    }
    y = 1;
  }
  bVar1 = Am_Object::Valid(&menu_bar);
  if ((bVar1) && (bVar1 = Am_Object::Valid(&local_28), bVar1)) {
    local_48[1] = 0;
    local_48[0] = 0;
    Am_Translate_Coordinates(&local_28,0,x - y,&Am_Screen,local_48 + 1,local_48);
    self_local._4_4_ = local_48[0];
  }
  else {
    self_local._4_4_ = 0;
  }
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&menu_bar);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, menu_bar_sub_win_top)
{
  Am_Object for_item = self.Get(Am_FOR_ITEM);
  Am_Object menu_bar = for_item.Get_Owner();
  Am_Widget_Look look = menu_bar.Get(Am_WIDGET_LOOK);
  int height = menu_bar.Get(Am_HEIGHT);

  int overlap = 0;
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    overlap = 5;
    break;

  case Am_WINDOWS_LOOK_val:
    overlap = 3;
    break;

  case Am_MACINTOSH_LOOK_val:
    overlap = 1;
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  if (for_item.Valid() && menu_bar.Valid()) {
    int x = 0; //initializations so no compiler warnings for translate_coords
    int y = 0;
    // get the coordinates of the bottom of the menu item w.r.t. the screen
    Am_Translate_Coordinates(menu_bar, 0, height - overlap, Am_Screen, x, y);
    return y;
  } else
    return 0;
}